

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tasks.c
# Opt level: O0

void InitTask(void)

{
  int iVar1;
  
  signal(2,ProgStop);
  CreateLogFile();
  iVar1 = setProgPri(100);
  if (iVar1 != 0) {
    printf("[WARNING]:");
    printf("Set priority unsuccessfully.\n");
    printf("\n");
  }
  if (DevType == RPI) {
    fd_serialport = serialOpen("/dev/ttyAMA0",0x1c200);
    printf("[TIPS]:");
    printf("Open /dev/ttyAMA0");
    printf("\n");
  }
  else if (DevType == PC) {
    fd_serialport = serialOpen("/dev/ttyUSB0",0x1c200);
    printf("[TIPS]:");
    printf("Open /dev/ttyUSB0");
    printf("\n");
  }
  if (fd_serialport < 0) {
    printf("[WARNING]:");
    printf("SerialPort failed to initialize. -err:%d",(ulong)(uint)fd_serialport);
    printf("\n");
    printf("[TIPS]:");
    printf("Please check whether there is a serial device plugged in.");
    printf("\n");
    printf("[TIPS]:");
    printf("Press ENTER to continue without connection.");
    printf("\n");
    getchar();
  }
  else {
    printf("[TIPS]:");
    printf("SerialPort initialized successfully. fd:%d",(ulong)(uint)fd_serialport);
    printf("\n");
  }
  Init_AllPara(2);
  SCurveCtrl_Init();
  PID_Init();
  Calc_Position2Zero();
  Calc_Body2Leg();
  Modify_Posture();
  if (sRobot_MotionPara.Gait == 1) {
    Calc_GaitTrajPolyCoeffi_Trot();
  }
  else if (sRobot_MotionPara.Gait == 2) {
    Calc_GaitTrajPolyCoeffi_Walk();
  }
  return;
}

Assistant:

void InitTask(void)
{
	signal(SIGINT, ProgStop);
	CreateLogFile();

	if (setProgPri(100) != 0)
		PRINTF_WARNING("Set priority unsuccessfully.\n");

	switch (DevType)
	{
	case RPI:
		fd_serialport = serialOpen("/dev/ttyAMA0", 115200);
		PRINTF_TIPS("Open /dev/ttyAMA0");
		break;
	case PC:
		fd_serialport = serialOpen("/dev/ttyUSB0", 115200);
		PRINTF_TIPS("Open /dev/ttyUSB0");
		break;
	}
	if (fd_serialport < 0)
	{
		PRINTF_WARNING("SerialPort failed to initialize. -err:%d", fd_serialport);
		PRINTF_TIPS("Please check whether there is a serial device plugged in.");
		PRINTF_TIPS("Press ENTER to continue without connection.");
		getchar();
	}
	else
	{
		PRINTF_TIPS("SerialPort initialized successfully. fd:%d", fd_serialport);
	}

	//serialTest(fd_serialport, FRAME_HEAD);

	Init_AllPara(GAIT_WALK);
	SCurveCtrl_Init();
	PID_Init();
	Calc_Position2Zero();
	Calc_Body2Leg();
	Modify_Posture();
	switch (sRobot_MotionPara.Gait)
	{
	case 1:
		Calc_GaitTrajPolyCoeffi_Trot();
		break;
	case 2:
		Calc_GaitTrajPolyCoeffi_Walk();
		break;
	}
}